

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recovery_test.cc
# Opt level: O2

void __thiscall
leveldb::RecoveryTest_ManifestReused_Test::~RecoveryTest_ManifestReused_Test
          (RecoveryTest_ManifestReused_Test *this)

{
  RecoveryTest::~RecoveryTest(&this->super_RecoveryTest);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(RecoveryTest, ManifestReused) {
  if (!CanAppend()) {
    std::fprintf(stderr,
                 "skipping test because env does not support appending\n");
    return;
  }
  ASSERT_LEVELDB_OK(Put("foo", "bar"));
  Close();
  std::string old_manifest = ManifestFileName();
  Open();
  ASSERT_EQ(old_manifest, ManifestFileName());
  ASSERT_EQ("bar", Get("foo"));
  Open();
  ASSERT_EQ(old_manifest, ManifestFileName());
  ASSERT_EQ("bar", Get("foo"));
}